

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controller.cpp
# Opt level: O1

void Controller::click::InternalClicker::clicker
               (int given_x,int given_y,bool autodiscover,Minefield *mfield,bool only_autodiscover,
               bool called_during_autodiscover)

{
  bool bVar1;
  long lVar2;
  int iVar3;
  int y;
  long lVar4;
  int iVar5;
  int local_50 [6];
  long local_38;
  
  bVar1 = Minefield::isPosValid(mfield,given_x,given_y);
  if (((bVar1) && (bVar1 = Minefield::isGameRunning(mfield), bVar1)) &&
     (bVar1 = Minefield::isFlagged(mfield,given_x,given_y), !bVar1)) {
    if ((autodiscover) && (bVar1 = Minefield::isOpen(mfield,given_x,given_y), bVar1)) {
      local_50[3] = -1;
      local_50[4] = 0;
      local_50[5] = 1;
      iVar5 = 0;
      lVar2 = 0;
      do {
        local_38 = lVar2;
        iVar3 = *(int *)((long)local_50 + lVar2 + 0xc) + given_x;
        local_50[0] = -1;
        local_50[1] = 0;
        local_50[2] = 1;
        lVar2 = 0;
        do {
          y = *(int *)((long)local_50 + lVar2) + given_y;
          bVar1 = Minefield::isPosValid(mfield,iVar3,y);
          if (bVar1) {
            bVar1 = Minefield::isFlagged(mfield,iVar3,y);
            iVar5 = iVar5 + (uint)bVar1;
          }
          lVar2 = lVar2 + 4;
        } while (lVar2 != 0xc);
        lVar2 = local_38 + 4;
      } while (lVar2 != 0xc);
      if ((iVar5 != 0) &&
         (iVar3 = Minefield::getSorroundingMineCount(mfield,given_x,given_y), iVar3 == iVar5)) {
        local_50[3] = -1;
        local_50[4] = 0;
        local_50[5] = 1;
        lVar2 = 0;
        do {
          iVar5 = *(int *)((long)local_50 + lVar2 + 0xc);
          local_50[0] = -1;
          local_50[1] = 0;
          local_50[2] = 1;
          lVar4 = 0;
          do {
            clicker(iVar5 + given_x,*(int *)((long)local_50 + lVar4) + given_y,false,mfield,
                    only_autodiscover,true);
            lVar4 = lVar4 + 4;
          } while (lVar4 != 0xc);
          lVar2 = lVar2 + 4;
        } while (lVar2 != 0xc);
      }
    }
    else if ((called_during_autodiscover) ||
            (iVar5 = Minefield::getOpenCount(mfield), !only_autodiscover || iVar5 == 0)) {
      Minefield::open(mfield,given_x,given_y,1);
      return;
    }
  }
  return;
}

Assistant:

static void clicker(int given_x, int given_y, bool autodiscover, Minefield& mfield, bool only_autodiscover, bool called_during_autodiscover = false) {
                // check pos
                if (mfield.isPosValid(given_x, given_y)) {
                    // only do stuff while game is still running
                    if (mfield.isGameRunning()) {
                        // only click on fields w/o flags
                        if(! mfield.isFlagged(given_x, given_y)) {
                            if (autodiscover && mfield.isOpen(given_x, given_y)) {
                                // already open -> autodiscover
                                // if all sorrounding mines are flagged -> open all other sorrounding fields
                                int flag_count = 0;
                                for (int dx : {-1, 0, 1}) {
                                    for (int dy: {-1, 0, 1}) {
                                        if (mfield.isPosValid(given_x + dx, given_y + dy)) {
                                            if (mfield.isFlagged(given_x + dx, given_y + dy)) {
                                                flag_count++;
                                            }
                                        }
                                    }
                                }

                                // don't treat 0 sorrounding mines, because handled by open function
                                if (0 != flag_count && mfield.getSorroundingMineCount(given_x, given_y) == flag_count) {
                                    for (int dx : {-1, 0, 1}) {
                                        for (int dy: {-1, 0, 1}) {
                                            clicker(given_x + dx, given_y + dy, false, mfield, only_autodiscover, true);
                                        }
                                    }
                                }
                            } else {
                                // no autodiscover -> open regularly
                                // unless autodiscover only enable
                                // unless called from autodiscover or no field opened yet
                                if (called_during_autodiscover || 0 == mfield.getOpenCount() || !only_autodiscover) {
                                    mfield.open(given_x, given_y);
                                }
                            }
                        }
                    }
                }
            }